

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_79cbb::ParserImpl::ParseFalseBranchStatement(ParserImpl *this)

{
  int iVar1;
  int iVar2;
  TokenDetail op;
  TokenDetail *pTVar3;
  Lexer *pLVar4;
  ParseException *pPVar5;
  ParserImpl *in_RSI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> false_branch;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> true_branch;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_58;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> block;
  int iStack_2c;
  
  pTVar3 = LookAhead(in_RSI);
  if (pTVar3->token_ == 0x104) {
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x104) {
      __assert_fail("current_.token_ == Token_Elseif",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x166,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseElseIfStatement()"
                   );
    }
    iVar1 = (in_RSI->current_).line_;
    local_58.number_ = 0.0;
    block._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
    super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
    super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)0x0;
    op._28_4_ = iStack_2c;
    op.token_ = 0x11e;
    op.line_ = 0;
    op.column_ = 0;
    op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
    op.module_ = (String *)0x0;
    ParseExp((ParserImpl *)&exp,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op,
             (int)&local_58);
    if (local_58.str_ != (String *)0x0) {
      (*((local_58.str_)->super_GCObject)._vptr_GCObject[1])();
    }
    pTVar3 = NextToken(in_RSI);
    if (pTVar3->token_ != 0x111) {
      pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar5,"expect \'then\' for elseif",&in_RSI->current_);
      __cxa_throw(pPVar5,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    ParseBlock((ParserImpl *)&true_branch);
    pTVar3 = LookAhead(in_RSI);
    iVar2 = pTVar3->line_;
    ParseFalseBranchStatement((ParserImpl *)&false_branch);
    pLVar4 = (Lexer *)operator_new(0x28);
    pLVar4->state_ = (State *)&PTR__ElseIfStatement_00198fe8;
    pLVar4->module_ =
         (String *)
         exp._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
         _M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    *(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> *)
     &(pLVar4->in_stream_).super__Function_base._M_functor =
         true_branch._M_t.
         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    ((__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> *)
    ((long)&(pLVar4->in_stream_).super__Function_base._M_functor + 8))->
    super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> =
         (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)
         false_branch._M_t.
         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    *(int *)&(pLVar4->in_stream_).super__Function_base._M_manager = iVar1;
    *(int *)((long)&(pLVar4->in_stream_).super__Function_base._M_manager + 4) = iVar2;
  }
  else {
    pTVar3 = LookAhead(in_RSI);
    if (pTVar3->token_ != 0x103) {
      pTVar3 = LookAhead(in_RSI);
      if (pTVar3->token_ == 0x105) {
        NextToken(in_RSI);
        this->lexer_ = (Lexer *)0x0;
        return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
               )(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
                 )this;
      }
      pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar5,"expect \'end\' for if",&in_RSI->look_ahead_);
      __cxa_throw(pPVar5,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x103) {
      __assert_fail("current_.token_ == Token_Else",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x189,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseElseStatement()"
                   );
    }
    ParseBlock((ParserImpl *)&block);
    pTVar3 = NextToken(in_RSI);
    if (pTVar3->token_ != 0x105) {
      pPVar5 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar5,"expect \'end\' for else",&in_RSI->current_);
      __cxa_throw(pPVar5,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    pLVar4 = (Lexer *)operator_new(0x10);
    pLVar4->state_ = (State *)&PTR__ElseStatement_00199028;
    pLVar4->module_ =
         (String *)
         block._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
         _M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  }
  this->lexer_ = pLVar4;
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)this;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseFalseBranchStatement()
        {
            if (LookAhead().token_ == Token_Elseif)
                return ParseElseIfStatement();
            else if (LookAhead().token_ == Token_Else)
                return ParseElseStatement();
            else if (LookAhead().token_ == Token_End)
                NextToken();            // skip 'end'
            else
                throw ParseException("expect 'end' for if", look_ahead_);

            return std::unique_ptr<SyntaxTree>();
        }